

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O3

bool __thiscall
DReachabilityPropagator::correctDominator
          (DReachabilityPropagator *this,int r,vector<bool,_std::allocator<bool>_> *v,int avoid)

{
  ulong *puVar1;
  uint uVar2;
  pointer pvVar3;
  uint *puVar4;
  BoolView *pBVar5;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  uint *puVar10;
  
  if (r != avoid) {
    iVar6 = r + 0x3f;
    if (-1 < r) {
      iVar6 = r;
    }
    uVar9 = (ulong)r;
    puVar1 = (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p +
             (long)(iVar6 >> 6) +
             (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
    *puVar1 = *puVar1 | 1L << ((byte)r & 0x3f);
    pvVar3 = (this->ou).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (uint *)pvVar3[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    pcVar7 = sat.assigns.data;
    for (puVar10 = *(uint **)&pvVar3[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data; puVar10 != puVar4; puVar10 = puVar10 + 1) {
      uVar2 = *puVar10;
      pBVar5 = (this->super_GraphPropagator).es.data;
      if ((pcVar7[(uint)pBVar5[uVar2].v] == '\0') ||
         ((uint)pBVar5[uVar2].s * 2 + -1 != (int)pcVar7[(uint)pBVar5[uVar2].v])) {
        pBVar5 = (this->super_GraphPropagator).vs.data;
        uVar2 = *(uint *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data + 4);
        uVar9 = (ulong)uVar2;
        if (pcVar7[(uint)pBVar5[uVar9].v] == '\0') {
          if (uVar2 != avoid) goto LAB_001cbace;
        }
        else if ((uVar2 != avoid) &&
                ((uint)pBVar5[uVar9].s * 2 + -1 != (int)pcVar7[(uint)pBVar5[uVar9].v])) {
LAB_001cbace:
          uVar8 = uVar2 + 0x3f;
          if (-1 < (int)uVar2) {
            uVar8 = uVar2;
          }
          if (((v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p
               [(long)((int)uVar8 >> 6) +
                (ulong)(((long)(int)uVar2 & 0x800000000000003fU) < 0x8000000000000001) +
                0xffffffffffffffff] >> ((long)(int)uVar2 & 0x3fU) & 1) == 0) {
            (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0xf])
                      (this,uVar9,v,(ulong)(uint)avoid);
            pcVar7 = sat.assigns.data;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool DReachabilityPropagator::correctDominator(int r, std::vector<bool>& v, int avoid) {
	if (r == avoid) {
		return true;
	}
	v[r] = true;
	if (DEBUG) {
		std::cout << "Visiting " << r << " " << avoid << " who is "
							<< (getNodeVar(r).isFixed() ? (getNodeVar(r).isTrue() ? "in" : "out") : "unfixed")
							<< '\n';
	}
	for (const int e : ou[r]) {
		if (getEdgeVar(e).isFixed() && getEdgeVar(e).isFalse()) {
			continue;
		}
		const int o = getHead(e);
		if (getNodeVar(o).isFixed() && getNodeVar(o).isFalse()) {
			continue;
		}
		if (o == avoid) {
			continue;
		}
		if (v[o]) {
			continue;
		}
		correctDominator(o, v, avoid);
	}
	return true;
}